

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsBool helicsCoreWaitForDisconnect(HelicsCore core,int msToWait,HelicsError *err)

{
  uint uVar1;
  Core *pCVar2;
  bool res;
  Core *cppcore;
  HelicsError *in_stack_ffffffffffffffb0;
  HelicsCore in_stack_ffffffffffffffb8;
  undefined8 local_38 [2];
  Core *local_28;
  int local_14 [4];
  uint local_4;
  
  pCVar2 = getCore(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pCVar2 == (Core *)0x0) {
    local_4 = 1;
  }
  else {
    local_28 = pCVar2;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)local_38,local_14);
    uVar1 = (*pCVar2->_vptr_Core[10])(pCVar2,local_38[0]);
    local_4 = (uint)((uVar1 & 1) != 0);
  }
  return local_4;
}

Assistant:

HelicsBool helicsCoreWaitForDisconnect(HelicsCore core, int msToWait, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return HELICS_TRUE;
    }
    try {
        const bool res = cppcore->waitForDisconnect(std::chrono::milliseconds(msToWait));
        return res ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}